

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

char * FT_Get_Postscript_Name(FT_Face face)

{
  FT_Driver pFVar1;
  FT_Module local_40;
  FT_Module local_38;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Pointer svc;
  FT_Service_PsFontName service;
  char *result;
  FT_Face face_local;
  
  service = (FT_Service_PsFontName)0x0;
  if (face != (FT_Face)0x0) {
    module = (FT_Module)(face->internal->services).service_POSTSCRIPT_FONT_NAME;
    if (module == (FT_Module)0xfffffffffffffffe) {
      module = (FT_Module)0x0;
    }
    else if (module == (FT_Module)0x0) {
      pFVar1 = face->driver;
      local_38 = (FT_Module)0x0;
      if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
        local_38 = (FT_Module)
                   (*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"postscript-font-name");
      }
      module = local_38;
      if (local_38 == (FT_Module)0x0) {
        local_40 = (FT_Module)0xfffffffffffffffe;
      }
      else {
        local_40 = local_38;
      }
      (face->internal->services).service_POSTSCRIPT_FONT_NAME = local_40;
    }
    if ((module != (FT_Module)0x0) && (module->clazz != (FT_Module_Class *)0x0)) {
      service = (FT_Service_PsFontName)(*(code *)module->clazz)(face);
    }
  }
  return (char *)service;
}

Assistant:

FT_EXPORT_DEF( const char* )
  FT_Get_Postscript_Name( FT_Face  face )
  {
    const char*  result = NULL;


    if ( !face )
      goto Exit;

    if ( !result )
    {
      FT_Service_PsFontName  service;


      FT_FACE_LOOKUP_SERVICE( face,
                              service,
                              POSTSCRIPT_FONT_NAME );

      if ( service && service->get_ps_font_name )
        result = service->get_ps_font_name( face );
    }

  Exit:
    return result;
  }